

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Target.cpp
# Opt level: O2

ModeSense __thiscall SCSI::Target::CommandState::mode_sense_specs(CommandState *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  pointer puVar4;
  uint16_t uVar5;
  uint uVar6;
  ModeSense MVar7;
  
  puVar4 = (this->data_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar1 = puVar4[1];
  bVar2 = puVar4[2];
  bVar3 = puVar4[3];
  uVar5 = number_of_blocks(this);
  MVar7.page_control_values._1_3_ = 0;
  MVar7._0_5_ = CONCAT14(bVar2 >> 5,(uint)(bVar1 >> 3)) & 0xff00000001;
  uVar6 = (uint)bVar3 << 8 | (uint)uVar5 << 0x10 | bVar2 & 0x3f;
  MVar7.page_code = (char)uVar6;
  MVar7.subpage_code = (char)(uVar6 >> 8);
  MVar7.allocated_bytes = (short)(uVar6 >> 0x10);
  return MVar7;
}

Assistant:

CommandState::ModeSense CommandState::mode_sense_specs() const {
	ModeSense specs;

	specs.exclude_block_descriptors = (data_[1] & 0x08);
	specs.page_control_values = ModeSense::PageControlValues(data_[2] >> 5);
	specs.page_code = data_[2] & 0x3f;
	specs.subpage_code = data_[3];
	specs.allocated_bytes = number_of_blocks();

	return specs;
}